

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  string *psVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  string *errorString;
  uint uVar8;
  snd_seq_event_t ev;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  puVar2 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar8 = (uint)size;
  if (*(uint *)(puVar2 + 4) < uVar8) {
    *(uint *)(puVar2 + 4) = uVar8;
    iVar3 = snd_midi_event_resize_buffer(puVar2[3],size & 0xffffffff);
    if (iVar3 == 0) {
      free((void *)puVar2[5]);
      pvVar4 = malloc((ulong)*(uint *)(puVar2 + 4));
      puVar2[5] = pvVar4;
      if (pvVar4 != (void *)0x0) goto LAB_00182b96;
      psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar1);
      std::__cxx11::string::string((string *)&local_d0,(string *)psVar1);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_d0);
      errorString = &local_d0;
    }
    else {
      psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar1);
      std::__cxx11::string::string((string *)&local_b0,(string *)psVar1);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_b0);
      errorString = &local_b0;
    }
LAB_00182cbc:
    std::__cxx11::string::~string((string *)errorString);
  }
  else {
LAB_00182b96:
    for (uVar6 = 0; (size & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      *(uchar *)(puVar2[5] + uVar6) = message[uVar6];
    }
    for (uVar7 = 0; uVar7 <= uVar8 && uVar8 - uVar7 != 0; uVar7 = uVar7 + (int)lVar5) {
      ev.data.raw32.d[0] = 0;
      ev.data.ext.ptr = (void *)0x0;
      ev.time.time.tv_nsec = 0;
      ev.source.client = '\0';
      ev.source.port = *(uchar *)((long)puVar2 + 0xc);
      ev.dest.client = 0xfe;
      ev.dest.port = 0xfd;
      ev._0_8_ = 0xfd000000;
      lVar5 = snd_midi_event_encode(puVar2[3],(ulong)uVar7 + puVar2[5],uVar8 - uVar7,&ev);
      if (lVar5 < 0) {
        psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        std::__cxx11::string::assign((char *)psVar1);
        errorString = &local_50;
        std::__cxx11::string::string((string *)errorString,(string *)psVar1);
        MidiApi::error((MidiApi *)this,WARNING,errorString);
        goto LAB_00182cbc;
      }
      if (ev.type == 0xff) {
        psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        std::__cxx11::string::assign((char *)psVar1);
        errorString = &local_70;
        std::__cxx11::string::string((string *)errorString,(string *)psVar1);
        MidiApi::error((MidiApi *)this,WARNING,errorString);
        goto LAB_00182cbc;
      }
      iVar3 = snd_seq_event_output(*puVar2,&ev);
      if (iVar3 < 0) {
        psVar1 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
        std::__cxx11::string::assign((char *)psVar1);
        errorString = &local_90;
        std::__cxx11::string::string((string *)errorString,(string *)psVar1);
        MidiApi::error((MidiApi *)this,WARNING,errorString);
        goto LAB_00182cbc;
      }
    }
    snd_seq_drain_output(*puVar2);
  }
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  long result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];

  unsigned int offset = 0;
  while (offset < nBytes) {
    snd_seq_event_t ev;
    snd_seq_ev_clear( &ev );
    snd_seq_ev_set_source( &ev, data->vport );
    snd_seq_ev_set_subs( &ev );
    snd_seq_ev_set_direct( &ev );
    result = snd_midi_event_encode( data->coder, data->buffer + offset,
                                    (long)(nBytes - offset), &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    if ( ev.type == SND_SEQ_EVENT_NONE ) {
      errorString_ = "MidiOutAlsa::sendMessage: incomplete message!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    offset += result;

    // Send the event.
    result = snd_seq_event_output( data->seq, &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }
  }
  snd_seq_drain_output( data->seq );
}